

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

uint __thiscall
glcts::GeometryShaderRenderingTrianglesCase::getAmountOfVerticesPerInstance
          (GeometryShaderRenderingTrianglesCase *this)

{
  uint uVar1;
  TestError *this_00;
  
  uVar1 = this->m_drawcall_mode - 4;
  if ((uVar1 < 10) && ((0x307U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(uint *)(&DAT_0179a0b4 + (ulong)uVar1 * 4);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized draw call mode",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0x1090);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

unsigned int GeometryShaderRenderingTrianglesCase::getAmountOfVerticesPerInstance()
{
	unsigned int result = 0;

	switch (m_drawcall_mode)
	{
	case GL_TRIANGLES:
	{
		result = 3 /* vertices making up a single triangle */ * 4 /* triangles */;

		break;
	}

	case GL_TRIANGLES_ADJACENCY_EXT:
	{
		result = 3 /* vertices making up a single triangle */ * 4 /* triangles */ * 2 /* adjacency data */;

		break;
	}

	case GL_TRIANGLE_FAN:
	{
		result = 6 /* vertices in total */;

		break;
	}

	case GL_TRIANGLE_STRIP:
	{
		result = 7 /* vertices in total */;

		break;
	}

	case GL_TRIANGLE_STRIP_ADJACENCY_EXT:
	{
		/* As per extension specification */
		result = (5 /* triangles */ + 2) * 2;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (m_drawcall_mode) */

	return result;
}